

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeHysteresis_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  pointer piVar1;
  int iVar2;
  pointer *__ptr;
  char *pcVar3;
  AssertionResult gtest_ar_1;
  size_type old_bucket_count;
  TypeParam ht;
  hasher local_f8;
  key_equal local_e8;
  pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_d8;
  AssertHelperData *local_b8;
  undefined1 local_b0 [8];
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_a8;
  
  iVar2 = UniqueObjectHelper<int>(1);
  this_00 = &(this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  *(bool *)((long)&(this->
                   super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   ).
                   super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.settings + 0x2a) = true;
  *(int *)((long)&(this->
                  super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  ).
                  super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.
                  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.key_info + 0xc) = iVar2;
  local_b8 = (AssertHelperData *)
             (this->
             super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.num_buckets;
  local_d8.first.ht._0_4_ = UniqueObjectHelper<int>(4);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<int_const&,int_const&>
            ((pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_b0,
             (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,(int *)&local_d8,(int *)&local_d8);
  local_b0._0_4_ = UniqueObjectHelper<int>(4);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_b0);
  iVar2 = UniqueObjectHelper<int>(4);
  local_d8.first.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_d8.first.ht._4_4_,iVar2);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&this_00->rep,1);
  google::
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<int_const&,int_const&>
            ((pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
              *)local_b0,
             (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)this_00,(int *)&local_d8,(int *)&local_d8);
  local_b0._0_4_ = UniqueObjectHelper<int>(4);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_b0);
  local_d8.first.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)(this->
          super_HashtableAllTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ).
          super_HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.
          super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.num_buckets;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_b0,"old_bucket_count","this->ht_.bucket_count()",
             (unsigned_long *)&local_b8,(unsigned_long *)&local_d8);
  if (local_b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if ((pointer)local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                 super_Hasher._0_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_a8.settings.
                         super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
                         _0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x583,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
    if (local_d8.first.ht !=
        (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      (**(code **)(*(long *)&((local_d8.first.ht)->settings).
                             super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher
                  + 8))();
    }
  }
  if ((pointer)local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               super_Hasher._0_8_ != (pointer)0x0) {
    if (*(pointer *)
         local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
         _0_8_ != (pointer)(local_a8.settings.
                            super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
                            _0_8_ + 0x10)) {
      operator_delete(*(pointer *)
                       local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                       super_Hasher._0_8_);
    }
    operator_delete((void *)local_a8.settings.
                            super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher.
                            _0_8_);
  }
  local_f8._0_8_ = (AssertHelperData *)0x0;
  local_f8.num_compares_ = 0;
  local_e8.id_ = 0;
  local_e8.num_hashes_ = 0;
  local_e8.num_compares_ = 0;
  local_d8.first.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)((ulong)local_d8.first.ht & 0xffffffff00000000);
  local_d8.first.pos = (pointer)0x0;
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_b0,2,&local_f8,&local_e8,(allocator_type *)&local_d8);
  local_f8.id_ = (undefined4)local_a8.num_buckets;
  local_f8.num_hashes_ = local_a8.num_buckets._4_4_;
  local_e8.id_ = 0x20;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((internal *)&local_d8,"ht.bucket_count()","32u",(unsigned_long *)&local_f8,
             (uint *)&local_e8);
  if ((char)local_d8.first.ht == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (local_d8.first.pos == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_d8.first.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x587,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((AssertHelperData *)local_f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  piVar1 = local_d8.first.pos;
  if (local_d8.first.pos != (pointer)0x0) {
    if (*(pointer *)local_d8.first.pos != local_d8.first.pos + 4) {
      operator_delete(*(pointer *)local_d8.first.pos);
    }
    operator_delete(piVar1);
  }
  iVar2 = UniqueObjectHelper<int>(1);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&local_a8);
  local_a8.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true;
  local_b8 = (AssertHelperData *)local_a8.num_buckets;
  local_a8.key_info.delkey = iVar2;
  iVar2 = UniqueObjectHelper<int>(4);
  local_f8.id_ = iVar2;
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_a8,1);
  google::
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<int_const&,int_const&>
            (&local_d8,
             (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_a8,&local_f8.id_,&local_f8.id_);
  iVar2 = UniqueObjectHelper<int>(4);
  local_d8.first.ht._0_4_ = iVar2;
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&local_a8,(key_type *)&local_d8);
  local_f8.id_ = UniqueObjectHelper<int>(4);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(&local_a8,1);
  google::
  dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert_noresize<int_const&,int_const&>
            (&local_d8,
             (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)&local_a8,&local_f8.id_,&local_f8.id_);
  iVar2 = UniqueObjectHelper<int>(4);
  local_d8.first.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)CONCAT44(local_d8.first.ht._4_4_,iVar2);
  google::
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&local_a8,(key_type *)&local_d8);
  local_f8.id_ = (undefined4)local_a8.num_buckets;
  local_f8.num_hashes_ = local_a8.num_buckets._4_4_;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_d8,"old_bucket_count","ht.bucket_count()",(unsigned_long *)&local_b8
             ,(unsigned_long *)&local_f8);
  if ((char)local_d8.first.ht == '\0') {
    testing::Message::Message((Message *)&local_f8);
    if (local_d8.first.pos == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_d8.first.pos;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x58e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e8,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e8);
    if ((AssertHelperData *)local_f8._0_8_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_f8._0_8_ + 8))();
    }
  }
  piVar1 = local_d8.first.pos;
  if (local_d8.first.pos != (pointer)0x0) {
    if (*(pointer *)local_d8.first.pos != local_d8.first.pos + 4) {
      operator_delete(*(pointer *)local_d8.first.pos);
    }
    operator_delete(piVar1);
  }
  local_b0 = (undefined1  [8])&PTR__BaseHashtableInterface_00c23618;
  if (local_a8.table != (pointer)0x0) {
    free(local_a8.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeHysteresis) {
  // We want to make sure that when we create a hashtable, and then
  // add and delete one element, the size of the hashtable doesn't
  // change.
  this->ht_.set_deleted_key(this->UniqueKey(1));
  typename TypeParam::size_type old_bucket_count = this->ht_.bucket_count();
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  this->ht_.insert(this->UniqueObject(4));
  this->ht_.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, this->ht_.bucket_count());

  // Try it again, but with a hashtable that starts very small
  TypeParam ht(2);
  EXPECT_LT(ht.bucket_count(), 32u);  // verify we really do start small
  ht.set_deleted_key(this->UniqueKey(1));
  old_bucket_count = ht.bucket_count();
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  ht.insert(this->UniqueObject(4));
  ht.erase(this->UniqueKey(4));
  EXPECT_EQ(old_bucket_count, ht.bucket_count());
}